

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O3

size_t __thiscall TxRequestTracker::Impl::CountCandidates(Impl *this,NodeId peer)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  size_t sVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  long in_FS_OFFSET;
  
  uVar1 = (this->m_peerinfo)._M_h._M_bucket_count;
  sVar3 = 0;
  uVar4 = (ulong)peer % uVar1;
  p_Var2 = (this->m_peerinfo)._M_h._M_buckets[uVar4];
  if (p_Var2 != (__node_base_ptr)0x0) {
    p_Var5 = p_Var2->_M_nxt;
    if (p_Var5[1]._M_nxt != (_Hash_node_base *)peer) {
      sVar3 = 0;
      do {
        p_Var5 = p_Var5->_M_nxt;
        if (p_Var5 == (_Hash_node_base *)0x0) goto LAB_00adf636;
        if ((ulong)p_Var5[1]._M_nxt % uVar1 != uVar4) goto LAB_00adf636;
      } while (p_Var5[1]._M_nxt != (_Hash_node_base *)peer);
    }
    sVar3 = (long)p_Var5[2]._M_nxt -
            ((long)&(p_Var5[3]._M_nxt)->_M_nxt + (long)&(p_Var5[4]._M_nxt)->_M_nxt);
  }
LAB_00adf636:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return sVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t CountCandidates(NodeId peer) const
    {
        auto it = m_peerinfo.find(peer);
        if (it != m_peerinfo.end()) return it->second.m_total - it->second.m_requested - it->second.m_completed;
        return 0;
    }